

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

ServiceOptions * __thiscall
google::protobuf::ServiceOptions::operator=(ServiceOptions *this,ServiceOptions *from)

{
  ulong uVar1;
  ulong uVar2;
  
  if (this != from) {
    uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar1 & 1) != 0) {
      uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
    }
    uVar2 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar2 & 1) != 0) {
      uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
    }
    if (uVar1 == uVar2) {
      InternalSwap(this,from);
    }
    else {
      CopyFrom(this,from);
    }
  }
  return this;
}

Assistant:

inline ServiceOptions& operator=(ServiceOptions&& from) noexcept {
    if (this == &from) return *this;
    if (::google::protobuf::internal::CanMoveWithInternalSwap(GetArena(), from.GetArena())) {
      InternalSwap(&from);
    } else {
      CopyFrom(from);
    }
    return *this;
  }